

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideTest::getShaderBody
          (XFBStrideTest *this,GLuint test_case_index,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  reference pvVar1;
  TestError *pTVar2;
  GLchar *text;
  char *local_38;
  GLchar *assignments;
  testCase *test_case;
  string *out_calculations_local;
  string *out_assignments_local;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBStrideTest *this_local;
  
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::XFBStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBStrideTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  std::__cxx11::string::operator=((string *)out_calculations,"");
  local_38 = "";
  if (pvVar1->m_stage == stage) {
    if (((stage != VERTEX) && (stage != TESS_EVAL)) && (stage != GEOMETRY)) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5fca);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_38 = getShaderBody::vs_tes_gs;
  }
  else if (3 < stage - VERTEX) {
    if (stage != FRAGMENT) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5fda);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_38 = getShaderBody::fs;
  }
  std::__cxx11::string::operator=((string *)out_assignments,local_38);
  if (stage == FRAGMENT) {
    text = Utils::Type::GetGLSLTypeName(&pvVar1->m_type);
    Utils::replaceAllTokens("TYPE",text,out_assignments);
  }
  return;
}

Assistant:

void XFBStrideTest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage, std::string& out_assignments,
								  std::string& out_calculations)
{
	const testCase& test_case = m_test_cases[test_case_index];

	out_calculations = "";

	static const GLchar* vs_tes_gs = "    goku = uni_goku;\n";
	static const GLchar* fs		   = "    fs_out = vec4(1, 0.25, 0.5, 0.75);\n"
							  "    if (TYPE(0) == goku)\n"
							  "    {\n"
							  "         fs_out = vec4(1, 0.75, 0.5, 0.5);\n"
							  "    }\n";

	const GLchar* assignments = "";

	if (test_case.m_stage == stage)
	{
		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			assignments = vs_tes_gs;
			break;
		case Utils::Shader::TESS_EVAL:
			assignments = vs_tes_gs;
			break;
		case Utils::Shader::VERTEX:
			assignments = vs_tes_gs;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}
	else
	{
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
			assignments = fs;
			break;
		case Utils::Shader::GEOMETRY:
		case Utils::Shader::TESS_CTRL:
		case Utils::Shader::TESS_EVAL:
		case Utils::Shader::VERTEX:
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
	}

	out_assignments = assignments;

	if (Utils::Shader::FRAGMENT == stage)
	{
		Utils::replaceAllTokens("TYPE", test_case.m_type.GetGLSLTypeName(), out_assignments);
	}
}